

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOICompactRewardDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall
TOICompactRewardDecPOMDPDiscrete::TOICompactRewardDecPOMDPDiscrete
          (TOICompactRewardDecPOMDPDiscrete *this,TOICompactRewardDecPOMDPDiscrete *o)

{
  E *this_00;
  allocator<char> local_8b;
  allocator<char> local_8a;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_48;
  
  *(undefined ***)&this->field_0x308 = &PTR__POSGInterface_006108f0;
  DecPOMDPInterface::DecPOMDPInterface((DecPOMDPInterface *)&this->field_0x308,&PTR_PTR_0060f1d8);
  *(undefined8 *)&this->field_0x310 = 0x610ad8;
  *(undefined8 *)&this->field_0x308 = 0x610c88;
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            ((DecPOMDPDiscreteInterface *)&this->field_0x308,&PTR_construction_vtable_232__0060f1b0)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"received unspec. by TOIDecPOMDPDiscrete",&local_89);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"received unspec. by TOIDecPOMDPDiscrete",&local_8a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"received unspec. by TOIDecPOMDPDiscrete",&local_8b);
  TOIDecPOMDPDiscrete::TOIDecPOMDPDiscrete
            (&this->super_TOIDecPOMDPDiscrete,&PTR_construction_vtable_96__0060f100,&local_48,
             &local_68,&local_88,false);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  *(undefined8 *)
   &(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
    super_MultiAgentDecisionProcess = 0x60e948;
  *(undefined8 *)&this->field_0x308 = 0x60ed28;
  *(undefined8 *)&this->field_0x310 = 0x60ef80;
  *(undefined8 *)
   &(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.field_0x280
       = 0x60eba0;
  (this->_m_p_rModels).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->super_TOIDecPOMDPDiscrete).field_0x2c0 = 0;
  *(undefined8 *)&this->field_0x2c8 = 0;
  *(undefined8 *)&this->field_0x2d0 = 0;
  (this->_m_nrTwoAgentActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrTwoAgentActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_nrTwoAgentActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_p_rModels).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_p_rModels).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"TOICompactRewardDecPOMDPDiscrete: copy ctor not yet implemented");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

TOICompactRewardDecPOMDPDiscrete::
TOICompactRewardDecPOMDPDiscrete(const TOICompactRewardDecPOMDPDiscrete& o) 
{
    throw(E("TOICompactRewardDecPOMDPDiscrete: copy ctor not yet implemented"));
}